

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::RawStringStmt::clone
          (RawStringStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined1 local_48 [8];
  shared_ptr<kratos::RawStringStmt> stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::
  make_shared<kratos::RawStringStmt,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  this_00 = &stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::RawStringStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  Stmt::copy_meta((Stmt *)__fn,(shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  peVar1 = stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)local_48;
  stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> RawStringStmt::clone() const {
    auto stmt = std::make_shared<RawStringStmt>(stmts_);
    copy_meta(stmt);
    return stmt;
}